

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void array_container_xor(array_container_t *array_1,array_container_t *array_2,
                        array_container_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  int min;
  
  min = array_2->cardinality + array_1->cardinality;
  if (out->capacity < min) {
    array_container_grow(out,min,false);
  }
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 1) == 0) {
    uVar2 = xor_uint16(array_1->array,array_1->cardinality,array_2->array,array_2->cardinality,
                       out->array);
  }
  else {
    uVar2 = xor_vector16(array_1->array,array_1->cardinality,array_2->array,array_2->cardinality,
                         out->array);
  }
  out->cardinality = uVar2;
  return;
}

Assistant:

void array_container_xor(const array_container_t *array_1,
                         const array_container_t *array_2,
                         array_container_t *out) {
    const int32_t card_1 = array_1->cardinality, card_2 = array_2->cardinality;
    const int32_t max_cardinality = card_1 + card_2;
    if (out->capacity < max_cardinality) {
        array_container_grow(out, max_cardinality, false);
    }

#if CROARING_IS_X64
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
        out->cardinality =
            xor_vector16(array_1->array, array_1->cardinality, array_2->array,
                         array_2->cardinality, out->array);
    } else {
        out->cardinality =
            xor_uint16(array_1->array, array_1->cardinality, array_2->array,
                       array_2->cardinality, out->array);
    }
#else
    out->cardinality =
        xor_uint16(array_1->array, array_1->cardinality, array_2->array,
                   array_2->cardinality, out->array);
#endif
}